

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::PythonParameter::MergePartialFromCodedStream(PythonParameter *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  string *psVar5;
  char *pcVar6;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  PythonParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_0079fe8b:
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      google::protobuf::io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto switchD_007a00a2_default;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) == 10) {
        psVar5 = mutable_module_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        module_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        module_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.PythonParameter.module");
        goto LAB_0079fe8b;
      }
      break;
    case 2:
      if ((tag_00 & 0xff) == 0x12) {
        psVar5 = mutable_layer_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        layer_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        layer_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.PythonParameter.layer");
        goto LAB_0079fe8b;
      }
      break;
    case 3:
      if ((tag_00 & 0xff) == 0x1a) {
        psVar5 = mutable_param_str_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        param_str_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        param_str_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"caffe.PythonParameter.param_str");
        goto LAB_0079fe8b;
      }
      break;
    case 4:
      if ((tag_00 & 0xff) != 0x20) break;
      set_has_share_in_parallel(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,&this->share_in_parallel_);
      goto joined_r0x007a0261;
    }
switchD_007a00a2_default:
    if ((tag_00 == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
       WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar1 = google::protobuf::internal::WireFormat::SkipField(input,tag_00,unknown_fields);
joined_r0x007a0261:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool PythonParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.PythonParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string module = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_module()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->module().data(), this->module().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.module");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string layer = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_layer()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->layer().data(), this->layer().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.layer");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string param_str = 3 [default = ""];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_param_str()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->param_str().data(), this->param_str().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.param_str");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool share_in_parallel = 4 [default = false];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_share_in_parallel();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &share_in_parallel_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.PythonParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.PythonParameter)
  return false;
#undef DO_
}